

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::version_parser::parse_build_metadata(version_parser *this,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  token_stream *ptVar2;
  char *pcVar3;
  errc eVar4;
  from_chars_result fVar5;
  string identifier;
  string result;
  string local_78;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  paVar1 = &local_78.field_2;
  local_38 = out;
  while( true ) {
    if (local_50 != 0) {
      std::__cxx11::string::push_back((char)&local_58);
    }
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    fVar5 = parse_build_identifier(this,&local_78);
    pcVar3 = fVar5.super_from_chars_result.ptr;
    eVar4 = fVar5.super_from_chars_result.ec;
    if (eVar4 != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0015eb3c;
    }
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    ptVar2 = this->stream;
    if ((ptVar2->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start[ptVar2->current].type != dot) break;
    ptVar2->current = ptVar2->current + 1;
  }
  std::__cxx11::string::_M_assign((string *)local_38);
  pcVar3 = (this->stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start[this->stream->current].lexeme;
  eVar4 = 0;
LAB_0015eb3c:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  fVar5.super_from_chars_result.ec = eVar4;
  fVar5.super_from_chars_result.ptr = pcVar3;
  fVar5.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar5.super_from_chars_result;
}

Assistant:

parse_build_metadata(std::string& out) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_build_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }